

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleinterp.cpp
# Opt level: O0

void __thiscall
BrainFuckInterpreter::BrainFuckInterpreter(BrainFuckInterpreter *this,BrainFuckProgram *p)

{
  uint8_t *puVar1;
  BrainFuckProgram *p_local;
  BrainFuckInterpreter *this_local;
  
  BrainFuckProgram::BrainFuckProgram(&this->p_,p);
  puVar1 = (uint8_t *)operator_new__(30000);
  this->tape_ = puVar1;
  this->dc_ = 0;
  this->pc_ = 0;
  return;
}

Assistant:

explicit BrainFuckInterpreter(BrainFuckProgram p) : p_(std::move(p)), tape_(new uint8_t[TAPE_SIZE]), pc_(0), dc_(0) {
    }